

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncDecVerify.cpp
# Opt level: O0

void incdec_verify::PreIncTestInt16(void)

{
  bool bVar1;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *pSVar2;
  SafeIntException *anon_var_0;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> vv;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  bool fSuccess;
  size_t i;
  allocator local_49;
  string local_48 [42];
  short local_1e;
  undefined1 in_stack_ffffffffffffffed;
  short in_stack_ffffffffffffffee;
  undefined2 in_stack_fffffffffffffff0;
  short sVar3;
  uint in_stack_fffffffffffffff4;
  ulong local_8;
  
  for (local_8 = 0; local_8 < 9; local_8 = local_8 + 1) {
    in_stack_fffffffffffffff4 = CONCAT13(1,(int3)in_stack_fffffffffffffff4);
    pSVar2 = (SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)&stack0xfffffffffffffff4;
    SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
              (pSVar2,(short *)(inc_int16 + local_8 * 6));
    pSVar2 = SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             ::operator++(pSVar2);
    local_1e = pSVar2->m_int;
    sVar3 = local_1e;
    bVar1 = operator!=((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        )0x0,0);
    if (bVar1) {
      in_stack_fffffffffffffff4 = in_stack_fffffffffffffff4 & 0xffffff;
    }
    if (((byte)(in_stack_fffffffffffffff4 >> 0x18) & 1) != (inc_int16[local_8 * 6 + 4] & 1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_48,"Error in case inc_int16 throw (1): ",&local_49);
      err_msg<short>((string *)
                     CONCAT44(in_stack_fffffffffffffff4,CONCAT22(sVar3,in_stack_fffffffffffffff0)),
                     in_stack_ffffffffffffffee,(bool)in_stack_ffffffffffffffed);
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
    }
  }
  return;
}

Assistant:

void PreIncTestInt16()
{
	size_t i;

	for( i = 0; i < COUNTOF(inc_int16); ++i )
	{
		bool fSuccess = true;
		try
		{
			SafeInt< std::int16_t > si(inc_int16[i].x);
			SafeInt< std::int16_t > vv = ++si;

			if(vv != inc_int16[i].y)
			{
				fSuccess = false;
			}
		}
		catch(SafeIntException&)
		{
			fSuccess = false;
		}

		if( fSuccess != inc_int16[i].fExpected )
		{
			err_msg( "Error in case inc_int16 throw (1): ", inc_int16[i].x, inc_int16[i].fExpected );
		}
	}
}